

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::LoopConstraint::calcVelocityError
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,MatrixNd *GSys,
          VectorNd *derrSysUpd,ConstraintCache *cache,bool updateKinematics)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  ulong __n;
  uint uVar7;
  ulong uVar8;
  reference rVar9;
  
  for (__n = 0; __n < (this->super_Constraint).sizeOfConstraint; __n = __n + 1) {
    (derrSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    [(this->super_Constraint).rowInSystem + (int)__n] = 0.0;
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&(this->super_Constraint).velocityConstraint,__n);
    if ((*rVar9._M_p & rVar9._M_mask) != 0) {
      lVar1 = (GSys->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      uVar6 = (ulong)((this->super_Constraint).rowInSystem + (int)__n);
      pdVar2 = (GSys->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      lVar3 = (GSys->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
      pdVar4 = (QDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      pdVar5 = (derrSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
      for (uVar7 = 0; uVar8 = (ulong)uVar7, (long)uVar8 < lVar3; uVar7 = uVar7 + 1) {
        pdVar5[uVar6] = pdVar2[uVar6 + lVar1 * uVar8] * pdVar4[uVar8] + pdVar5[uVar6];
      }
    }
  }
  return;
}

Assistant:

void LoopConstraint::calcVelocityError(  Model &model,
                            const double time,
                            const Math::VectorNd &Q,
                            const Math::VectorNd &QDot,
                            const Math::MatrixNd &GSys,
                            Math::VectorNd &derrSysUpd,
                            ConstraintCache &cache,
                            bool updateKinematics)
{
  //SimpleMath cannot handle multiplying a block matrix by a vector
  //Using a for loop here to maintain backwards compatibility.
  //Rant: all of this ugliness for a dot product! Does anyone even use
  //      SimpleMath?

  //derrSysUpd.block(rowInSystem,0,sizeOfConstraint,1) =
  //    GSys.block(rowInSystem,0,sizeOfConstraint,GSys.cols())*QDot;

  for(unsigned int i=0; i<sizeOfConstraint;++i){
    derrSysUpd[rowInSystem+i] = 0;
    if(velocityConstraint[i]){
      for(unsigned int j=0; j<GSys.cols();++j){
        derrSysUpd[rowInSystem+i] +=
             GSys(rowInSystem+i,j)*QDot[j];
      }
    }
  }

}